

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O3

void serialization::unserialize_helper<serialization::xml_iarchive,std::__cxx11::string,Person>
               (xml_iarchive *ar,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
               *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  size_type i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person> tmp;
  string local_d0;
  Person local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  local_88;
  const_iterator local_40;
  _Alloc_node local_38;
  
  sVar3 = xml_iarchive::load_sequence_start(ar);
  if (sVar3 != 0) {
    paVar1 = &local_d0.field_2;
    paVar2 = &local_b0.name.field_2;
    local_40._M_node = &(v->_M_t)._M_impl.super__Rb_tree_header._M_header;
    i = 0;
    do {
      xml_iarchive::load_sequence_item_start(ar,i);
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      local_b0.age = 0;
      local_b0._36_4_ = 0;
      local_b0.name.field_2._M_allocated_capacity = 0;
      local_b0.name.field_2._8_8_ = 0;
      local_b0.name._M_string_length = 0;
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      local_b0.name._M_dataplus._M_p = (pointer)paVar2;
      xml_iarchive::load_key_start(ar,"first");
      xml_iarchive::load(ar,&local_d0);
      std::
      deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
      pop_back(&(ar->stack_).c);
      xml_iarchive::load_key_start(ar,"second");
      Person::unserialize_impl<serialization::xml_iarchive>(&local_b0,ar);
      std::
      deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
      pop_back(&(ar->stack_).c);
      local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar1) {
        local_88.first.field_2._8_8_ = local_d0.field_2._8_8_;
      }
      else {
        local_88.first._M_dataplus._M_p = local_d0._M_dataplus._M_p;
      }
      local_88.first.field_2._M_allocated_capacity._1_7_ =
           local_d0.field_2._M_allocated_capacity._1_7_;
      local_88.first.field_2._M_local_buf[0] = local_d0.field_2._M_local_buf[0];
      local_88.second.name._M_dataplus._M_p = (pointer)&local_88.second.name.field_2;
      local_88.first._M_string_length = local_d0._M_string_length;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.name._M_dataplus._M_p == paVar2) {
        local_88.second.name.field_2._8_8_ = local_b0.name.field_2._8_8_;
      }
      else {
        local_88.second.name._M_dataplus._M_p = local_b0.name._M_dataplus._M_p;
      }
      local_88.second.name.field_2._M_allocated_capacity =
           local_b0.name.field_2._M_allocated_capacity;
      local_88.second.name._M_string_length = local_b0.name._M_string_length;
      local_b0.name._M_string_length = 0;
      local_b0.name.field_2._M_allocated_capacity =
           local_b0.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_88.second.age = local_b0.age;
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      local_b0.name._M_dataplus._M_p = (pointer)paVar2;
      local_38._M_t = &v->_M_t;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Person>,std::_Select1st<std::pair<std::__cxx11::string_const,Person>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>
      ::
      _M_insert_unique_<std::pair<std::__cxx11::string_const,Person>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Person>,std::_Select1st<std::pair<std::__cxx11::string_const,Person>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Person>,std::_Select1st<std::pair<std::__cxx11::string_const,Person>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>
                  *)v,local_40,&local_88,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.second.name._M_dataplus._M_p != &local_88.second.name.field_2) {
        operator_delete(local_88.second.name._M_dataplus._M_p,
                        local_88.second.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
        operator_delete(local_88.first._M_dataplus._M_p,
                        local_88.first.field_2._M_allocated_capacity + 1);
      }
      xml_iarchive::load_sequence_item_end(ar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0.name._M_dataplus._M_p,
                        local_b0.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      i = i + 1;
    } while (sVar3 != i);
  }
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  pop_back(&(ar->stack_).c);
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  pop_back(&(ar->stack_).c);
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::map<Key, Value> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        typename std::pair<Key, Value> tmp;
        unserialize_helper(ar, tmp);
        *std::insert_iterator<std::map<Key, Value>>(v, v.end()) = std::move(tmp);
        ar.load_sequence_item_end();
    }
    ar.load_sequence_end();
}